

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::RandCaseStatement::Item>::
emplace_back<slang::ast::RandCaseStatement::Item>
          (SmallVectorBase<slang::ast::RandCaseStatement::Item> *this,Item *args)

{
  ulong uVar1;
  pointer p;
  Statement *pSVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pIVar5;
  long lVar6;
  long lVar7;
  pointer __src;
  size_type sVar8;
  ulong uVar9;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    pSVar2 = (args->stmt).ptr;
    (__src->expr).ptr = (args->expr).ptr;
    (__src->stmt).ptr = pSVar2;
    sVar8 = this->len;
    this->len = sVar8 + 1;
    return this->data_ + sVar8;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)__src - (long)this->data_;
  pIVar3 = (pointer)operator_new(uVar9 << 4);
  pSVar2 = (args->stmt).ptr;
  *(undefined8 *)((long)pIVar3 + lVar7) = (args->expr).ptr;
  ((undefined8 *)((long)pIVar3 + lVar7))[1] = pSVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 0x10 - (long)__src);
  pIVar4 = p;
  pIVar5 = pIVar3;
  if (lVar6 == 0) {
    pIVar4 = pIVar3;
    pIVar5 = p;
    if (sVar8 != 0) {
      do {
        pSVar2 = (pIVar5->stmt).ptr;
        (pIVar4->expr).ptr = (pIVar5->expr).ptr;
        (pIVar4->stmt).ptr = pSVar2;
        pIVar5 = pIVar5 + 1;
        pIVar4 = pIVar4 + 1;
      } while (pIVar5 != __src);
    }
  }
  else {
    for (; pIVar4 != __src; pIVar4 = pIVar4 + 1) {
      pSVar2 = (pIVar4->stmt).ptr;
      (pIVar5->expr).ptr = (pIVar4->expr).ptr;
      (pIVar5->stmt).ptr = pSVar2;
      pIVar5 = pIVar5 + 1;
    }
    memcpy((void *)((long)pIVar3 + lVar7 + 0x10),__src,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pIVar3;
  return (reference)((long)pIVar3 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }